

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.h
# Opt level: O0

bool __thiscall spvtools::opt::LoopPeeling::CanPeelLoop(LoopPeeling *this)

{
  bool bVar1;
  uint32_t uVar2;
  CFG *this_00;
  BasicBlock *pBVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  size_type sVar4;
  const_iterator cVar5;
  const_iterator cVar6;
  CFG *cfg;
  LoopPeeling *this_local;
  
  this_00 = IRContext::cfg(this->context_);
  if (this->loop_iteration_count_ == (Instruction *)0x0) {
    this_local._7_1_ = false;
  }
  else if (this->int_type_ == (Integer *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar2 = analysis::Integer::width(this->int_type_);
    if (uVar2 == 0x20) {
      bVar1 = Loop::IsLCSSA(this->loop_);
      if (bVar1) {
        pBVar3 = Loop::GetMergeBlock(this->loop_);
        if (pBVar3 == (BasicBlock *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          pBVar3 = Loop::GetMergeBlock(this->loop_);
          uVar2 = BasicBlock::id(pBVar3);
          this_01 = CFG::preds(this_00,uVar2);
          sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
          if (sVar4 == 1) {
            bVar1 = IsConditionCheckSideEffectFree(this);
            if (bVar1) {
              cVar5 = std::
                      unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                      ::cbegin(&this->exit_value_);
              cVar6 = std::
                      unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
                      ::cend(&this->exit_value_);
              bVar1 = std::
                      any_of<std::__detail::_Node_const_iterator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>,false,false>,spvtools::opt::LoopPeeling::CanPeelLoop()const::_lambda(std::pair<unsigned_int,spvtools::opt::Instruction*>)_1_>
                                (cVar5.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                 ._M_cur,cVar6.
                                         super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_false>
                                         ._M_cur);
              this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CanPeelLoop() const {
    CFG& cfg = *context_->cfg();

    if (!loop_iteration_count_) {
      return false;
    }
    if (!int_type_) {
      return false;
    }
    if (int_type_->width() != 32) {
      return false;
    }
    if (!loop_->IsLCSSA()) {
      return false;
    }
    if (!loop_->GetMergeBlock()) {
      return false;
    }
    if (cfg.preds(loop_->GetMergeBlock()->id()).size() != 1) {
      return false;
    }
    if (!IsConditionCheckSideEffectFree()) {
      return false;
    }

    return !std::any_of(exit_value_.cbegin(), exit_value_.cend(),
                        [](std::pair<uint32_t, Instruction*> it) {
                          return it.second == nullptr;
                        });
  }